

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

shared_ptr<kratos::Var> __thiscall
kratos::EnableStmtVisitor::get_cond(EnableStmtVisitor *this,Stmt *stmt)

{
  allocator<kratos::IRNode_*> *this_00;
  initializer_list<kratos::IRNode_*> __l;
  __buckets_ptr pp_Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  IRNodeKind IVar5;
  StatementType SVar6;
  undefined4 extraout_var;
  __shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *this_01;
  Stmt *pSVar7;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *this_02;
  StmtException *this_03;
  size_type __n;
  reference __r;
  size_type sVar8;
  __buckets_ptr pp_Var9;
  __shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_04;
  element_type *peVar10;
  element_type *peVar11;
  element_type *peVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  shared_ptr<kratos::Var> sVar14;
  undefined1 local_208 [8];
  shared_ptr<kratos::Var> rest_expr;
  undefined1 local_1f0 [32];
  enable_shared_from_this<kratos::Var> local_1d0;
  __buckets_ptr local_1c0;
  uint64_t i;
  undefined8 local_1b0;
  shared_ptr<kratos::Const> *local_1a8;
  pointer local_1a0;
  type *stmt_blk_1;
  type *cond_1;
  _Self local_188;
  const_iterator __end5;
  const_iterator __begin5;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *__range5;
  vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
  conditions;
  shared_ptr<kratos::Var> or_;
  Stmt *local_140;
  Stmt **local_138;
  element_type *local_130;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_128;
  allocator<char> local_109;
  string local_108;
  undefined1 local_e8 [32];
  __shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *local_c8;
  type *stmt_blk;
  type *cond;
  undefined1 local_b0 [8];
  const_iterator __end4;
  const_iterator __begin4;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *__range4;
  bool found;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *body;
  SwitchStmt *switch_;
  undefined1 local_70 [32];
  undefined1 local_50 [24];
  IfStmt *if_;
  shared_ptr<kratos::Var> expr;
  Stmt *parent_stmt;
  IRNode *ir_parent;
  Stmt *stmt_local;
  
  iVar4 = (*(stmt->super_IRNode)._vptr_IRNode[4])();
  IVar5 = IRNode::ir_node_kind((IRNode *)CONCAT44(extraout_var,iVar4));
  if (IVar5 == GeneratorKind) {
    std::shared_ptr<kratos::Var>::shared_ptr((shared_ptr<kratos::Var> *)this,(nullptr_t)0x0);
    _Var13._M_pi = extraout_RDX;
    goto LAB_003e8627;
  }
  expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar4);
  std::shared_ptr<kratos::Var>::shared_ptr((shared_ptr<kratos::Var> *)&if_);
  SVar6 = Stmt::type((Stmt *)expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
  if (SVar6 == If) {
    local_50._16_8_ =
         expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    this_01 = &IfStmt::then_body((IfStmt *)
                                 expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->
               super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
    pSVar7 = (Stmt *)std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                               (this_01);
    if (pSVar7 == stmt) {
      IfStmt::predicate((IfStmt *)local_50);
      std::shared_ptr<kratos::Var>::operator=
                ((shared_ptr<kratos::Var> *)&if_,(shared_ptr<kratos::Var> *)local_50);
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_50);
    }
    else {
      IfStmt::predicate((IfStmt *)local_70);
      peVar11 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_70);
      Var::r_not(peVar11);
      std::enable_shared_from_this<kratos::Var>::shared_from_this
                ((enable_shared_from_this<kratos::Var> *)(local_70 + 0x10));
      std::shared_ptr<kratos::Var>::operator=
                ((shared_ptr<kratos::Var> *)&if_,(shared_ptr<kratos::Var> *)(local_70 + 0x10));
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)(local_70 + 0x10));
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_70);
    }
LAB_003e8554:
    get_cond((EnableStmtVisitor *)local_208,
             (Stmt *)expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_208);
    if (bVar3) {
      peVar11 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&if_);
      peVar12 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_208);
      Var::operator&&(peVar11,peVar12);
      std::enable_shared_from_this<kratos::Var>::shared_from_this
                ((enable_shared_from_this<kratos::Var> *)this);
    }
    else {
      std::shared_ptr<kratos::Var>::shared_ptr
                ((shared_ptr<kratos::Var> *)this,(shared_ptr<kratos::Var> *)&if_);
    }
    rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         1;
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_208);
  }
  else {
    SVar6 = Stmt::type((Stmt *)expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
    if (SVar6 == Switch) {
      this_02 = SwitchStmt::body((SwitchStmt *)
                                 expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
      bVar3 = false;
      __end4 = std::
               map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
               ::begin(this_02);
      local_b0 = (undefined1  [8])
                 std::
                 map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                 ::end(this_02);
      while (bVar2 = std::operator!=(&__end4,(_Self *)local_b0), bVar2) {
        cond = &std::
                _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
                ::operator*(&__end4)->first;
        stmt_blk = (type *)std::
                           get<0ul,std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>
                                     ((pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>
                                       *)cond);
        local_c8 = &std::
                    get<1ul,std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>
                              ((pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>
                                *)cond)->
                    super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
        pSVar7 = (Stmt *)std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                                   (local_c8);
        if (pSVar7 == stmt) {
          bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)stmt_blk);
          if (bVar3) {
            SwitchStmt::target((SwitchStmt *)local_e8);
            peVar11 = std::
                      __shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_e8);
            peVar10 = std::
                      __shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator*((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)stmt_blk);
            Var::eq(peVar11,&peVar10->super_Var);
            std::enable_shared_from_this<kratos::Var>::shared_from_this
                      ((enable_shared_from_this<kratos::Var> *)(local_e8 + 0x10));
            std::shared_ptr<kratos::Var>::operator=
                      ((shared_ptr<kratos::Var> *)&if_,(shared_ptr<kratos::Var> *)(local_e8 + 0x10))
            ;
            std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)(local_e8 + 0x10));
            std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_e8);
          }
          bVar3 = true;
          break;
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
        ::operator++(&__end4);
      }
      if (!bVar3) {
        or_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1;
        this_03 = (StmtException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"Incorrect statement block stage",&local_109);
        local_138 = &local_140;
        local_130 = (element_type *)0x1;
        this_00 = (allocator<kratos::IRNode_*> *)
                  ((long)&or_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 7);
        local_140 = stmt;
        std::allocator<kratos::IRNode_*>::allocator(this_00);
        __l._M_len = (size_type)local_130;
        __l._M_array = (iterator)local_138;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_128,__l,this_00);
        StmtException::StmtException(this_03,&local_108,&local_128);
        or_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0;
        __cxa_throw(this_03,&StmtException::typeinfo,StmtException::~StmtException);
      }
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&if_);
      if (!bVar3) {
        std::shared_ptr<kratos::Var>::shared_ptr
                  ((shared_ptr<kratos::Var> *)
                   &conditions.
                    super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>::
        vector((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                *)&__range5);
        __n = std::
              map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
              ::size(this_02);
        std::
        vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>::
        reserve((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                 *)&__range5,__n);
        __end5 = std::
                 map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                 ::begin(this_02);
        local_188._M_node =
             (_Base_ptr)
             std::
             map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
             ::end(this_02);
        while (bVar3 = std::operator!=(&__end5,&local_188), bVar3) {
          cond_1 = &std::
                    _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
                    ::operator*(&__end5)->first;
          stmt_blk_1 = (type *)std::
                               get<0ul,std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>
                                         ((pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>
                                           *)cond_1);
          local_1a0 = (pointer)std::
                               get<1ul,std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>
                                         ((pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>
                                           *)cond_1);
          bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)stmt_blk_1);
          if (bVar3) {
            std::
            vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>::
            emplace_back<std::shared_ptr<kratos::Const>const&>
                      ((vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>
                        *)&__range5,(shared_ptr<kratos::Const> *)stmt_blk_1);
          }
          std::
          _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
          ::operator++(&__end5);
        }
        local_1a8 = (shared_ptr<kratos::Const> *)
                    std::
                    vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                    ::begin((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                             *)&__range5);
        local_1b0 = std::
                    vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                    ::end((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                           *)&__range5);
        std::
        sort<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,kratos::EnableStmtVisitor::get_cond(kratos::Stmt*)::_lambda(std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::Const>const&)_1_>
                  (local_1a8,local_1b0);
        __r = std::
              vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
              ::operator[]((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                            *)&__range5,0);
        std::shared_ptr<kratos::Var>::operator=
                  ((shared_ptr<kratos::Var> *)
                   &conditions.
                    super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__r);
        sVar8 = std::
                vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                ::size((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                        *)&__range5);
        if (1 < sVar8) {
          for (local_1c0 = (__buckets_ptr)0x1; pp_Var1 = local_1c0,
              pp_Var9 = (__buckets_ptr)
                        std::
                        vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                        ::size((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                                *)&__range5), pp_Var1 < pp_Var9;
              local_1c0 = (__buckets_ptr)((long)local_1c0 + 1)) {
            peVar11 = std::
                      __shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&conditions.
                                     super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
            this_04 = (__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                         ::operator[]((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                                       *)&__range5,(size_type)local_1c0);
            peVar10 = std::
                      __shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator*(this_04);
            Var::operator||(peVar11,&peVar10->super_Var);
            std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_1d0);
            std::shared_ptr<kratos::Var>::operator=
                      ((shared_ptr<kratos::Var> *)
                       &conditions.
                        super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (shared_ptr<kratos::Var> *)&local_1d0);
            std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_1d0);
          }
        }
        SwitchStmt::target((SwitchStmt *)local_1f0);
        peVar11 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1f0);
        peVar12 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator*((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&conditions.
                                super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        Var::operator!=(peVar11,peVar12);
        std::enable_shared_from_this<kratos::Var>::shared_from_this
                  ((enable_shared_from_this<kratos::Var> *)(local_1f0 + 0x10));
        std::shared_ptr<kratos::Var>::operator=
                  ((shared_ptr<kratos::Var> *)&if_,(shared_ptr<kratos::Var> *)(local_1f0 + 0x10));
        std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)(local_1f0 + 0x10));
        std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_1f0);
        std::
        vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>::
        ~vector((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                 *)&__range5);
        std::shared_ptr<kratos::Var>::~shared_ptr
                  ((shared_ptr<kratos::Var> *)
                   &conditions.
                    super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      goto LAB_003e8554;
    }
    get_cond(this,(Stmt *)expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi);
    rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         1;
  }
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&if_);
  _Var13._M_pi = extraout_RDX_00;
LAB_003e8627:
  sVar14.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  sVar14.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Var>)sVar14.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static std::shared_ptr<Var> get_cond(Stmt* stmt) {
        auto* ir_parent = stmt->parent();
        if (ir_parent->ir_node_kind() == IRNodeKind::GeneratorKind) {
            return nullptr;
        }
        auto* parent_stmt = reinterpret_cast<Stmt*>(ir_parent);
        std::shared_ptr<Var> expr;
        if (parent_stmt->type() == StatementType::If) {
            // need to figure out which block it belongs to
            auto* if_ = reinterpret_cast<IfStmt*>(parent_stmt);
            if (if_->then_body().get() == stmt) {
                expr = if_->predicate();
            } else {
                expr = if_->predicate()->r_not().shared_from_this();
            }
        } else if (parent_stmt->type() == StatementType::Switch) {
            auto* switch_ = reinterpret_cast<SwitchStmt*>(parent_stmt);
            // figure out which condition it is in. notice that we could be in the default
            // branch as well
            auto const& body = switch_->body();
            bool found = false;
            for (auto const& [cond, stmt_blk] : body) {
                if (stmt_blk.get() == stmt) {
                    // it's this condition
                    if (cond) expr = switch_->target()->eq(*cond).shared_from_this();
                    found = true;
                    break;
                }
            }
            if (!found) {
                throw StmtException("Incorrect statement block stage", {stmt});
            }
            if (!expr) {
                // it's the default one. we nor them together
                std::shared_ptr<Var> or_;
                std::vector<std::shared_ptr<Const>> conditions;
                conditions.reserve(body.size());
                for (auto const& [cond, stmt_blk] : body) {
                    if (cond) conditions.emplace_back(cond);
                }
                // sort conditions based on the value. it's guarantee to be unique
                // so no problems of overlap
                std::sort(
                    conditions.begin(), conditions.end(),
                    [](const std::shared_ptr<Const>& left, const std::shared_ptr<Const>& right) {
                        return left->value() < right->value();
                    });
                or_ = conditions[0];
                if (conditions.size() > 1) {
                    for (uint64_t i = 1; i < conditions.size(); i++) {
                        or_ = or_->operator||(*conditions[i]).shared_from_this();
                    }
                }
                expr = (switch_->target()->operator!=(*or_)).shared_from_this();
            }
        } else {
            return get_cond(parent_stmt);
        }
        auto rest_expr = get_cond(parent_stmt);
        if (rest_expr) {
            return expr->operator&&(*rest_expr).shared_from_this();
        } else {
            return expr;
        }
    }